

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  bool bVar1;
  undefined8 *in_RDI;
  AssertionResult *in_stack_00000008;
  Colour colour;
  undefined8 in_stack_ffffffffffffffa8;
  Code _colourCode;
  ostream *poVar2;
  Colour *in_stack_ffffffffffffffb0;
  string *psVar3;
  string local_40 [40];
  AssertionResult *in_stack_ffffffffffffffe8;
  
  _colourCode = (Code)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  bVar1 = AssertionResult::hasExpandedExpression(in_stack_00000008);
  if (bVar1) {
    anon_unknown.dwarf_9346f::dimColour();
    Colour::Colour(in_stack_ffffffffffffffb0,_colourCode);
    std::operator<<((ostream *)*in_RDI," for: ");
    Colour::~Colour((Colour *)0x256be6);
    poVar2 = (ostream *)*in_RDI;
    psVar3 = local_40;
    AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_ffffffffffffffe8);
    std::operator<<(poVar2,psVar3);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
        if (result.hasExpandedExpression()) {
            {
                Colour colour(dimColour());
                stream << " for: ";
            }
            stream << result.getExpandedExpression();
        }
    }